

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmMakefileTargetGenerator::MacOSXContentGeneratorType::operator()
          (MacOSXContentGeneratorType *this,cmSourceFile *source,char *pkgloc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  cmMakefileTargetGenerator *pcVar4;
  cmLocalUnixMakefileGenerator3 *this_00;
  bool bVar5;
  string *psVar6;
  string copyEcho;
  string output;
  string local_e8;
  string copyCommand;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  string input;
  string macdir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  
  bVar5 = cmTarget::IsBundleOnApple(this->Generator->Target);
  if (bVar5) {
    cmOSXBundleGenerator::InitMacOSXContentDirectory_abi_cxx11_
              (&macdir,this->Generator->OSXBundleGenerator,pkgloc);
    psVar6 = cmSourceFile::GetFullPath_abi_cxx11_(source);
    pcVar3 = (psVar6->_M_dataplus)._M_p;
    input._M_dataplus._M_p = (pointer)&input.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&input,pcVar3,pcVar3 + psVar6->_M_string_length);
    output._M_dataplus._M_p = (pointer)&output.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&output,macdir._M_dataplus._M_p,
               macdir._M_dataplus._M_p + macdir._M_string_length);
    std::__cxx11::string::append((char *)&output);
    cmsys::SystemTools::GetFilenameName(&copyEcho,&input);
    std::__cxx11::string::_M_append((char *)&output,(ulong)copyEcho._M_dataplus._M_p);
    paVar1 = &copyEcho.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)copyEcho._M_dataplus._M_p != paVar1) {
      operator_delete(copyEcho._M_dataplus._M_p,copyEcho.field_2._M_allocated_capacity + 1);
    }
    pcVar4 = this->Generator;
    cmOutputConverter::Convert
              (&copyEcho,&(pcVar4->LocalGenerator->super_cmLocalGenerator).super_cmOutputConverter,
               &output,START_OUTPUT,UNCHANGED);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &pcVar4->CleanFiles,&copyEcho);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)copyEcho._M_dataplus._M_p != paVar1) {
      operator_delete(copyEcho._M_dataplus._M_p,copyEcho.field_2._M_allocated_capacity + 1);
    }
    cmOutputConverter::Convert
              (&copyEcho,
               &(this->Generator->LocalGenerator->super_cmLocalGenerator).super_cmOutputConverter,
               &output,HOME_OUTPUT,UNCHANGED);
    std::__cxx11::string::operator=((string *)&output,(string *)&copyEcho);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)copyEcho._M_dataplus._M_p != paVar1) {
      operator_delete(copyEcho._M_dataplus._M_p,copyEcho.field_2._M_allocated_capacity + 1);
    }
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&depends,&input);
    copyEcho._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&copyEcho,"Copying OS X content ","");
    std::__cxx11::string::_M_append((char *)&copyEcho,(ulong)output._M_dataplus._M_p);
    this_00 = this->Generator->LocalGenerator;
    std::__cxx11::string::string
              ((string *)&copyCommand,copyEcho._M_dataplus._M_p,(allocator *)&local_e8);
    cmLocalUnixMakefileGenerator3::AppendEcho
              (this_00,&commands,&copyCommand,EchoBuild,(EchoProgress *)0x0);
    paVar2 = &copyCommand.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)copyCommand._M_dataplus._M_p != paVar2) {
      operator_delete(copyCommand._M_dataplus._M_p,copyCommand.field_2._M_allocated_capacity + 1);
    }
    copyCommand._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&copyCommand,"$(CMAKE_COMMAND) -E copy ","");
    cmOutputConverter::Convert
              (&local_e8,
               &(this->Generator->LocalGenerator->super_cmLocalGenerator).super_cmOutputConverter,
               &input,NONE,SHELL);
    std::__cxx11::string::_M_append((char *)&copyCommand,(ulong)local_e8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&copyCommand);
    cmOutputConverter::Convert
              (&local_e8,
               &(this->Generator->LocalGenerator->super_cmLocalGenerator).super_cmOutputConverter,
               &output,NONE,SHELL);
    std::__cxx11::string::_M_append((char *)&copyCommand,(ulong)local_e8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&commands,&copyCommand);
    cmLocalUnixMakefileGenerator3::WriteMakeRule
              (this->Generator->LocalGenerator,(ostream *)this->Generator->BuildFileStream,
               (char *)0x0,&output,&depends,&commands,false,false);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->Generator->ExtraFiles,&output);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)copyCommand._M_dataplus._M_p != paVar2) {
      operator_delete(copyCommand._M_dataplus._M_p,copyCommand.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)copyEcho._M_dataplus._M_p != paVar1) {
      operator_delete(copyEcho._M_dataplus._M_p,copyEcho.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&commands);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&depends);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)output._M_dataplus._M_p != &output.field_2) {
      operator_delete(output._M_dataplus._M_p,output.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)input._M_dataplus._M_p != &input.field_2) {
      operator_delete(input._M_dataplus._M_p,input.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)macdir._M_dataplus._M_p != &macdir.field_2) {
      operator_delete(macdir._M_dataplus._M_p,macdir.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void
cmMakefileTargetGenerator::MacOSXContentGeneratorType::operator()
  (cmSourceFile const& source, const char* pkgloc)
{
  // Skip OS X content when not building a Framework or Bundle.
  if(!this->Generator->GetTarget()->IsBundleOnApple())
    {
    return;
    }

  std::string macdir =
    this->Generator->OSXBundleGenerator->InitMacOSXContentDirectory(pkgloc);

  // Get the input file location.
  std::string input = source.GetFullPath();

  // Get the output file location.
  std::string output = macdir;
  output += "/";
  output += cmSystemTools::GetFilenameName(input);
  this->Generator->CleanFiles.push_back(
    this->Generator->Convert(output,
                             cmLocalGenerator::START_OUTPUT));
  output = this->Generator->Convert(output,
                                    cmLocalGenerator::HOME_OUTPUT);

  // Create a rule to copy the content into the bundle.
  std::vector<std::string> depends;
  std::vector<std::string> commands;
  depends.push_back(input);
  std::string copyEcho = "Copying OS X content ";
  copyEcho += output;
  this->Generator->LocalGenerator->AppendEcho(
    commands, copyEcho.c_str(),
    cmLocalUnixMakefileGenerator3::EchoBuild);
  std::string copyCommand = "$(CMAKE_COMMAND) -E copy ";
  copyCommand += this->Generator->Convert(input,
                                          cmLocalGenerator::NONE,
                                          cmLocalGenerator::SHELL);
  copyCommand += " ";
  copyCommand += this->Generator->Convert(output,
                                          cmLocalGenerator::NONE,
                                          cmLocalGenerator::SHELL);
  commands.push_back(copyCommand);
  this->Generator->LocalGenerator->WriteMakeRule(
    *this->Generator->BuildFileStream, 0,
    output,
    depends, commands, false);
  this->Generator->ExtraFiles.insert(output);
}